

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_backend_nodes_makefuncs.cpp
# Opt level: O1

PGAExpr * duckdb_libpgquery::makeSimpleAExpr
                    (PGAExpr_Kind kind,char *name,PGNode *lexpr,PGNode *rexpr,int location)

{
  PGAExpr *pPVar1;
  PGValue *datum;
  PGList *pPVar2;
  
  pPVar1 = (PGAExpr *)newNode(0x28,T_PGAExpr);
  pPVar1->kind = kind;
  datum = makeString(name);
  pPVar2 = lcons(datum,(PGList *)0x0);
  pPVar1->name = pPVar2;
  pPVar1->lexpr = lexpr;
  pPVar1->rexpr = rexpr;
  pPVar1->location = location;
  return pPVar1;
}

Assistant:

PGAExpr *makeSimpleAExpr(PGAExpr_Kind kind, const char *name, PGNode *lexpr, PGNode *rexpr, int location) {
	PGAExpr *a = makeNode(PGAExpr);

	a->kind = kind;
	a->name = list_make1(makeString((char *)name));
	a->lexpr = lexpr;
	a->rexpr = rexpr;
	a->location = location;
	return a;
}